

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::CalcResidualT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *this,TPZElementMatrixT<double> *ef)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  long lVar6;
  long *plVar7;
  TPZIntPoints *rval;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  REAL detJac;
  TPZManVector<int,_3> intorder;
  TPZManVector<double,_3> intpointtemp;
  TPZManVector<double,_3> intpoint;
  TPZFMatrix<double> jac;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<double>,_3> datavec;
  TPZAutoPointer<TPZIntPoints> TStack_19a20;
  long lStack_19a18;
  int iStack_19a0c;
  double dStack_19a08;
  TPZGeoEl *pTStack_19a00;
  long *plStack_199f8;
  undefined1 auStack_199f0 [16];
  undefined1 auStack_199e0 [16];
  int aiStack_199d0 [4];
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *pTStack_199c0;
  ulong uStack_199b8;
  double dStack_199b0;
  TPZManVector<int,_3> TStack_199a8;
  undefined1 auStack_19978 [16];
  TPZManVector<double,_3> TStack_19960;
  TPZManVector<double,_3> TStack_19928;
  undefined1 auStack_198f0 [24];
  undefined2 uStack_198d8;
  undefined1 auStack_198d0 [16];
  int64_t iStack_198c0;
  undefined1 auStack_198b8 [32];
  int aiStack_19898 [6];
  undefined **ppuStack_19880;
  undefined1 auStack_19878 [16];
  int64_t iStack_19868;
  undefined1 auStack_19860 [24];
  undefined2 uStack_19848;
  undefined1 auStack_19840 [16];
  int64_t iStack_19830;
  undefined1 auStack_19828 [32];
  int aiStack_19808 [6];
  undefined **ppuStack_197f0;
  undefined1 auStack_197e8 [16];
  int64_t iStack_197d8;
  undefined1 auStack_197d0 [24];
  undefined2 uStack_197b8;
  undefined1 auStack_197b0 [16];
  int64_t iStack_197a0;
  undefined1 auStack_19798 [32];
  int aiStack_19778 [6];
  undefined **ppuStack_19760;
  undefined1 auStack_19758 [16];
  int64_t iStack_19748;
  TPZManVector<TPZTransform<double>,_10> TStack_19740;
  TPZManVector<TPZMaterialDataT<double>,_3> TStack_186e0;
  
  lVar6 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))();
  if ((lVar6 == 0) ||
     (plStack_199f8 =
           (long *)__dynamic_cast(lVar6,&TPZMaterial::typeinfo,
                                  &TPZMatCombinedSpacesT<double>::typeinfo),
     plStack_199f8 == (long *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "void TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::CalcResidualT(TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoPyramid, TVar = double]"
               ,0x8e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
    TPZElementMatrixT<double>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
    return;
  }
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x100))(this);
  iVar4 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))(this)
  ;
  if (iVar4 != 0) {
    TPZManVector<TPZMaterialDataT<double>,_3>::TPZManVector(&TStack_186e0,0);
    lVar6 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
    (*TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>._vptr_TPZVec[3])(&TStack_186e0,lVar6);
    (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x288))
              (this,&TStack_186e0,0);
    TPZManVector<TPZTransform<double>,_10>::TPZManVector(&TStack_19740,0);
    (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
              (this,&TStack_19740);
    iVar4 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                      (this);
    TStack_19a20.fRef = (TPZReference *)operator_new(0x10);
    ((TStack_19a20.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
    (TStack_19a20.fRef)->fPointer = (TPZIntPoints *)0x0;
    LOCK();
    ((TStack_19a20.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
    UNLOCK();
    lVar11 = (long)iVar4;
    auStack_198f0._0_8_ = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector(&TStack_19928,lVar11,(double *)auStack_198f0);
    auStack_198f0._0_8_ = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector(&TStack_19960,lVar11,(double *)auStack_198f0);
    dStack_19a08 = 0.0;
    lStack_19a18 = lVar11;
    TPZVec<int>::TPZVec((TPZVec<int> *)auStack_199f0,0);
    auStack_199f0._8_8_ = aiStack_199d0;
    auStack_199f0._0_8_ = &PTR__TPZManVector_0181bce8;
    auStack_199e0 = (undefined1  [16])0x0;
    if (0 < lVar6) {
      lVar11 = 17000;
      lVar12 = 0;
      pTStack_199c0 = this;
      do {
        lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                         lVar12);
        if ((lVar1 != 0) &&
           (plVar7 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                            &TPZInterpolationSpace::typeinfo,0),
           plVar7 != (long *)0x0)) {
          TPZManVector<int,_3>::Resize
                    ((TPZManVector<int,_3> *)auStack_199f0,auStack_199e0._0_8_ + 1);
          uVar3 = auStack_199e0._0_8_;
          uVar5 = (**(code **)(*plVar7 + 0x268))(plVar7);
          *(undefined4 *)
           ((long)((TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                  super_TPZMaterialData).super_TPZShapeData.fCornerNodeIds.fExtAlloc +
           lVar11 + -0x30) = uVar5;
          *(undefined4 *)(auStack_199f0._8_8_ + ((uVar3 << 0x20) + -0x100000000 >> 0x1e)) = uVar5;
          this = pTStack_199c0;
        }
        lVar12 = lVar12 + 0x10;
        lVar11 = lVar11 + 0x8230;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    iStack_19a0c = (**(code **)(*plStack_199f8 + 0x48))(plStack_199f8,auStack_199f0);
    pTStack_19a00 = TPZCompEl::Reference((TPZCompEl *)this);
    lVar6 = lStack_19a18;
    iVar4 = (**(code **)(*(long *)pTStack_19a00 + 0xf0))();
    rval = (TPZIntPoints *)
           (**(code **)(*(long *)pTStack_19a00 + 0x70))(pTStack_19a00,iVar4 + -1,iStack_19a0c);
    TPZAutoPointer<TPZIntPoints>::operator=(&TStack_19a20,rval);
    TPZManVector<int,_3>::TPZManVector(&TStack_199a8,lVar6,&iStack_19a0c);
    (*(TStack_19a20.fRef)->fPointer->_vptr_TPZIntPoints[5])
              ((TStack_19a20.fRef)->fPointer,&TStack_199a8,0);
    iVar4 = (*(TStack_19a20.fRef)->fPointer->_vptr_TPZIntPoints[3])();
    lStack_19a18 = CONCAT44(lStack_19a18._4_4_,iVar4);
    if (1000 < iVar4) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                 ,0x3c1);
    }
    auStack_198f0._8_16_ = (undefined1  [16])0x0;
    uStack_198d8._0_1_ = '\0';
    uStack_198d8._1_1_ = '\0';
    auStack_198f0._0_8_ = &PTR__TPZFMatrix_018151d8;
    auStack_198d0 = (undefined1  [16])0x0;
    iStack_198c0 = 0;
    TPZVec<int>::TPZVec((TPZVec<int> *)auStack_198b8,0);
    auStack_198b8._8_8_ = aiStack_19898;
    auStack_198b8._0_8_ = &PTR__TPZManVector_01815498;
    auStack_198b8._16_16_ = (undefined1  [16])0x0;
    ppuStack_19880 = &PTR__TPZVec_01813df0;
    auStack_19878 = (undefined1  [16])0x0;
    iStack_19868 = 0;
    auStack_197d0._8_16_ = (undefined1  [16])0x0;
    uStack_197b8._0_1_ = '\0';
    uStack_197b8._1_1_ = '\0';
    auStack_197d0._0_8_ = &PTR__TPZFMatrix_018151d8;
    auStack_197b0 = (undefined1  [16])0x0;
    iStack_197a0 = 0;
    TPZVec<int>::TPZVec((TPZVec<int> *)auStack_19798,0);
    auStack_19798._8_8_ = aiStack_19778;
    auStack_19798._0_8_ = &PTR__TPZManVector_01815498;
    auStack_19798._16_16_ = (undefined1  [16])0x0;
    ppuStack_19760 = &PTR__TPZVec_01813df0;
    auStack_19758 = (undefined1  [16])0x0;
    iStack_19748 = 0;
    auStack_19860._8_16_ = (undefined1  [16])0x0;
    uStack_19848._0_1_ = '\0';
    uStack_19848._1_1_ = '\0';
    auStack_19860._0_8_ = &PTR__TPZFMatrix_018151d8;
    auStack_19840 = (undefined1  [16])0x0;
    iStack_19830 = 0;
    TPZVec<int>::TPZVec((TPZVec<int> *)auStack_19828,0);
    auStack_19828._8_8_ = aiStack_19808;
    auStack_19828._0_8_ = &PTR__TPZManVector_01815498;
    auStack_19828._16_16_ = (undefined1  [16])0x0;
    ppuStack_197f0 = &PTR__TPZVec_01813df0;
    auStack_197e8 = (undefined1  [16])0x0;
    iStack_197d8 = 0;
    if (0 < (int)(uint)lStack_19a18) {
      uStack_199b8 = (ulong)((uint)TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fNElements +
                             3 & 0xfffffffc);
      lVar6 = (ulong)((uint)TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fNElements &
                     0x7fffffff) - 1;
      auStack_19978._8_4_ = (int)lVar6;
      auStack_19978._0_8_ = lVar6;
      auStack_19978._12_4_ = (int)((ulong)lVar6 >> 0x20);
      uVar10 = 0;
      auStack_19978 = auStack_19978 ^ _DAT_014d28c0;
      do {
        (*(TStack_19a20.fRef)->fPointer->_vptr_TPZIntPoints[4])
                  ((TStack_19a20.fRef)->fPointer,(ulong)uVar10,&TStack_19960,&dStack_19a08);
        TPZGeoEl::Jacobian(pTStack_19a00,&TStack_19960.super_TPZVec<double>,
                           (TPZFMatrix<double> *)auStack_198f0,(TPZFMatrix<double> *)auStack_197d0,
                           &dStack_199b0,(TPZFMatrix<double> *)auStack_19860);
        auVar2 = _DAT_014d28c0;
        dStack_19a08 = ABS(dStack_199b0) * dStack_19a08;
        if (0 < (int)(uint)TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fNElements) {
          piVar8 = &TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fStore[3].
                    super_TPZMaterialData.intLocPtIndex;
          uVar9 = uStack_199b8;
          auVar13 = _DAT_014d28b0;
          auVar14 = _DAT_014d2b10;
          do {
            auVar15 = auVar13 ^ auVar2;
            iVar4 = auStack_19978._4_4_;
            if ((bool)(~(auVar15._4_4_ == iVar4 && auStack_19978._0_4_ < auVar15._0_4_ ||
                        iVar4 < auVar15._4_4_) & 1)) {
              piVar8[-0x61a4] = uVar10;
            }
            if ((auVar15._12_4_ != auStack_19978._12_4_ || auVar15._8_4_ <= auStack_19978._8_4_) &&
                auVar15._12_4_ <= auStack_19978._12_4_) {
              piVar8[-0x4118] = uVar10;
            }
            auVar15 = auVar14 ^ auVar2;
            iVar16 = auVar15._4_4_;
            if (iVar16 <= iVar4 && (iVar16 != iVar4 || auVar15._0_4_ <= auStack_19978._0_4_)) {
              piVar8[-0x208c] = uVar10;
              *piVar8 = uVar10;
            }
            lVar6 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 4;
            auVar13._8_8_ = lVar6 + 4;
            lVar6 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 4;
            auVar14._8_8_ = lVar6 + 4;
            piVar8 = piVar8 + 0x8230;
            uVar9 = uVar9 - 4;
          } while (uVar9 != 0);
        }
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x2a8))
                  (this,&TStack_19960,&TStack_19740,&TStack_186e0);
        (**(code **)(*plStack_199f8 + 0x70))(dStack_19a08,plStack_199f8,&TStack_186e0,&ef->fMat);
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)lStack_19a18);
    }
    CleanupMaterialDataT<double>(this,&TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)auStack_19860);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)auStack_197d0);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)auStack_198f0);
    if (TStack_199a8.super_TPZVec<int>.fStore != TStack_199a8.fExtAlloc) {
      TStack_199a8.super_TPZVec<int>.fNAlloc = 0;
      TStack_199a8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (TStack_199a8.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(TStack_199a8.super_TPZVec<int>.fStore);
      }
    }
    if ((int *)auStack_199f0._8_8_ != aiStack_199d0) {
      auStack_199e0._8_8_ = 0;
      auStack_199f0._0_8_ = &PTR__TPZVec_01813ef0;
      if ((int *)auStack_199f0._8_8_ != (int *)0x0) {
        operator_delete__((void *)auStack_199f0._8_8_);
      }
    }
    TPZManVector<double,_3>::~TPZManVector(&TStack_19960);
    TPZManVector<double,_3>::~TPZManVector(&TStack_19928);
    TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&TStack_19a20);
    TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&TStack_19740);
    TPZManVector<TPZMaterialDataT<double>,_3>::~TPZManVector(&TStack_186e0);
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcResidualT(TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ef.Reset();
        return;
    }
    
    InitializeElementMatrix(ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,3> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,3> intpoint(dim,0.), intpointtemp(dim,0.);
    REAL weight = 0.;
    
    TPZManVector<int,3> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,3> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    int nmeshes = datavec.size();
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int imesh = 0; imesh < nmeshes; imesh++) {
            datavec[imesh].intLocPtIndex = int_ind;
        }
        
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ef.fMat);
    }//loop over integratin points
    
    CleanupMaterialData(datavec);
    
}